

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O0

void KConfigExport::dump_source(MetaConfiguration *conf,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  element_type *top;
  path local_298;
  string local_270;
  undefined1 local_240 [8];
  path path;
  ofstream source;
  string *filename_local;
  MetaConfiguration *conf_local;
  
  std::ofstream::ofstream(&path._M_cmpts,filename,0x10);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_240,filename,auto_format);
  poVar2 = std::operator<<((ostream *)&path._M_cmpts,"// clang-format off");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  dump_notice((ofstream *)&path._M_cmpts);
  poVar2 = std::operator<<((ostream *)&path._M_cmpts,"#include \"");
  std::filesystem::__cxx11::path::stem(&local_298,(path *)local_240);
  std::filesystem::__cxx11::path::generic_string(&local_270,&local_298);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,".h\"");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_270);
  std::filesystem::__cxx11::path::~path(&local_298);
  poVar2 = std::operator<<((ostream *)&path._M_cmpts,"#include <KConfig>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&path._M_cmpts,"#include <KConfigGroup>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&path._M_cmpts,"#include <KSharedConfig>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&path._M_cmpts,std::endl<char,std::char_traits<char>>);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    poVar2 = std::operator<<((ostream *)&path._M_cmpts,"namespace ");
    poVar2 = std::operator<<(poVar2,(string *)&conf->conf_namespace);
    poVar2 = std::operator<<(poVar2," {");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&conf->top_level_class);
  if (bVar1) {
    top = std::__shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>::get
                    (&(conf->top_level_class).
                      super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>);
    anon_unknown.dwarf_51ec9::dump_source_class(top,(ofstream *)&path._M_cmpts);
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    poVar2 = std::operator<<((ostream *)&path._M_cmpts,"}");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&path._M_cmpts,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&path._M_cmpts,"// clang-format on");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::filesystem::__cxx11::path::~path((path *)local_240);
  std::ofstream::~ofstream(&path._M_cmpts);
  return;
}

Assistant:

void dump_source(const MetaConfiguration &conf, const std::string &filename)
{
  std::ofstream source(filename);
  std::filesystem::path path(filename);

  source << "// clang-format off" << std::endl;

  dump_notice(source);

  source << "#include \"" << path.stem().generic_string() << ".h\""
         << std::endl;
  source << "#include <KConfig>" << std::endl;
  source << "#include <KConfigGroup>" << std::endl;
  source << "#include <KSharedConfig>" << std::endl;

  source << std::endl;

  if (conf.conf_namespace.size()) {
    source << "namespace " << conf.conf_namespace << " {" << std::endl
           << std::endl;
  }

  if (conf.top_level_class) {
    dump_source_class(conf.top_level_class.get(), source);
  }

  if (conf.conf_namespace.size()) {
    source << "}" << std::endl;
  }

  source << std::endl;
  source << "// clang-format on" << std::endl;

}